

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O3

int lj_carith_op(lua_State *L,MMS mm)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  CTypeID CVar4;
  CTSize CVar5;
  long lVar6;
  CType *pCVar7;
  CType *pCVar8;
  void *pvVar9;
  cTValue *tv;
  TValue *pTVar10;
  GCstr *pGVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  uint uVar15;
  uint64_t uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ErrMsg em;
  undefined4 in_register_00000034;
  CTState *pCVar20;
  TValue TVar21;
  long lVar22;
  MMS mm_00;
  TValue TVar23;
  int iVar24;
  bool bVar25;
  uint64_t uVar26;
  ulong *puVar27;
  uint64_t u0;
  CDArith ca;
  ulong local_88 [3];
  undefined8 local_70;
  ulong local_68;
  CTState *local_60;
  TValue local_58 [2];
  CType *local_48 [2];
  ulong *local_38;
  
  local_70 = CONCAT44(in_register_00000034,mm);
  pCVar20 = *(CTState **)((L->glref).ptr64 + 0x180);
  pCVar20->L = L;
  TVar21 = (TValue)L->base;
  if (L->top <= (TValue *)(TVar21.u64 + 8)) {
    lj_err_argt(L,1,10);
  }
  bVar14 = true;
  pTVar10 = local_58;
  bVar25 = true;
  lVar6 = 8;
  uVar19 = 0;
  local_38 = local_88;
  local_60 = pCVar20;
  do {
    uVar17 = *(ulong *)TVar21;
    uVar13 = (long)uVar17 >> 0x2f;
    if (uVar13 == 0xfffffffffffffff5) {
      uVar1 = *(ushort *)((uVar17 & 0x7fffffffffff) + 10);
      pCVar8 = pCVar20->tab;
      uVar3 = pCVar8[uVar1].info;
      uVar15 = uVar3 & 0xf0000000;
      TVar23.u64 = (uVar17 & 0x7fffffffffff) + 0x10;
      if (uVar3 >> 0x1c == 6) {
        TVar23.u64 = *TVar23.u64;
        CVar4 = lj_ctype_intern(pCVar20,uVar1 | 0x20030000,8);
        pCVar8 = local_60->tab;
        pCVar7 = pCVar8 + CVar4;
        uVar3 = pCVar7->info;
        uVar15 = uVar3 & 0xf0000000;
        pCVar20 = local_60;
      }
      else {
        pCVar7 = pCVar8 + uVar1;
        if (uVar3 >> 0x1c == 2) {
          if (pCVar7->size == 4) {
            uVar2 = *(uint *)TVar23;
            TVar23.field_4.it = 0;
            TVar23.u64._0_4_ = uVar2;
          }
          else {
            TVar23.u64 = *TVar23.u64;
          }
          if ((uVar3 & 0xf0800000) == 0x20800000) {
            uVar2 = uVar3 & 0xffff;
            uVar3 = pCVar8[uVar2].info;
            uVar15 = uVar3 & 0xf0000000;
            pCVar7 = pCVar8 + uVar2;
          }
        }
      }
      pCVar8 = pCVar8 + (uVar3 & 0xffff);
      if (uVar15 != 0x50000000) {
        pCVar8 = pCVar7;
      }
LAB_0014cef9:
      local_48[uVar19] = pCVar8;
      pTVar10->u64 = (uint64_t)TVar23;
LAB_0014cf01:
      if (!bVar25) break;
    }
    else {
      if (uVar13 < 0xfffffffffffffff2) {
        pCVar8 = pCVar20->tab + 0xe;
        TVar23 = TVar21;
        goto LAB_0014cef9;
      }
      if (uVar17 == 0xffffffffffffffff) {
        pCVar8 = pCVar20->tab + 0x11;
        TVar23.u64 = 0;
        goto LAB_0014cef9;
      }
      if (uVar13 != 0xfffffffffffffffb) {
        pCVar8 = (CType *)0x0;
        TVar23.u64 = 1;
        bVar14 = false;
        goto LAB_0014cef9;
      }
      uVar1 = *(ushort *)((*(ulong *)(TVar21.u64 + lVar6) & 0x7fffffffffff) + 10);
      pCVar8 = pCVar20->tab;
      uVar3 = pCVar8[uVar1].info;
      local_48[uVar19] = (CType *)0x0;
      pTVar10->u64 = (uint64_t)((GCstr *)(uVar17 & 0x7fffffffffff) + 1);
      bVar14 = false;
      if ((uVar3 & 0xf0000000) != 0x50000000) goto LAB_0014cf01;
      pCVar8 = pCVar8 + uVar1;
      pCVar7 = lj_ctype_getfieldq(pCVar20,pCVar8,(GCstr *)(uVar17 & 0x7fffffffffff),
                                  (CTSize *)local_88,(CTInfo *)0x0);
      pCVar20 = local_60;
      if ((pCVar7 == (CType *)0x0) || ((pCVar7->info & 0xf0000000) != 0xb0000000)) {
        local_48[uVar19 ^ 1] = pCVar8;
        local_58[uVar19 ^ 1].u64 = 0;
        goto LAB_0014d2cf;
      }
      local_48[uVar19] =
           (CType *)((long)&local_60->tab->info + (ulong)((pCVar7->info & 0xffff) * 0x18));
      pTVar10->u64 = (uint64_t)&pCVar7->size;
      bVar14 = true;
      if (!bVar25) goto LAB_0014cf36;
    }
    pTVar10 = local_58 + 1;
    TVar21.u64 = TVar21.u64 + 8;
    uVar19 = 1;
    lVar6 = -8;
    bVar25 = false;
  } while( true );
  if (!bVar14) {
LAB_0014d2cf:
    uVar26 = 0xffff7fffffffffff;
    pTVar10 = L->base;
    mm_00 = (MMS)local_70;
    if ((pTVar10->u64 & 0xffff800000000000) == 0xfffa800000000000) {
      uVar1 = *(ushort *)((pTVar10->u64 & 0x7fffffffffff) + 10);
      uVar3 = pCVar20->tab[uVar1].info;
      uVar15 = (uint)uVar1;
      if ((uVar3 & 0xf0000000) == 0x20000000) {
        uVar15 = uVar3 & 0xffff;
      }
      tv = lj_ctype_meta(pCVar20,uVar15,mm_00);
      if (tv != (cTValue *)0x0) goto LAB_0014d3af;
      pTVar10 = L->base;
    }
    if ((pTVar10 + 1 < L->top) &&
       (uVar19 = pTVar10[1].u64, (uVar19 & 0xffff800000000000) == 0xfffa800000000000)) {
      uVar1 = *(ushort *)((uVar19 & 0x7fffffffffff) + 10);
      uVar3 = pCVar20->tab[uVar1].info;
      uVar15 = (uint)uVar1;
      if ((uVar3 & 0xf0000000) == 0x20000000) {
        uVar15 = uVar3 & 0xffff;
      }
      tv = lj_ctype_meta(pCVar20,uVar15,mm_00);
      pCVar20 = local_60;
      if (tv != (cTValue *)0x0) {
LAB_0014d3af:
        iVar18 = lj_meta_tailcall(L,tv);
        return iVar18;
      }
    }
    if (mm_00 == MM_eq) {
      if (local_58[0].u64 == local_58[1].u64) {
        uVar26 = 0xfffeffffffffffff;
      }
      L->top[-1].u64 = uVar26;
      *(uint64_t *)((L->glref).ptr64 + 0xf0) = uVar26;
      return 1;
    }
    lVar6 = 0xffffffff;
    lVar12 = 0;
    lVar22 = 0xffffffff;
    bVar14 = true;
    do {
      bVar25 = bVar14;
      pCVar8 = local_48[lVar12];
      uVar19 = L->base[lVar12].it64 & 0xffff800000000000;
      if ((pCVar8 == (CType *)0x0) || (uVar19 != 0xfffa800000000000)) {
        if (uVar19 == 0xfffd800000000000) {
          lVar6 = lVar12;
        }
        uVar19 = L->base[lVar12].it64 >> 0x2f;
        uVar17 = ~uVar19;
        if (uVar19 < 0xfffffffffffffff3) {
          uVar17 = 0xd;
        }
        pGVar11 = (GCstr *)lj_obj_itypename[uVar17];
      }
      else {
        if ((pCVar8->info & 0xf0000000) == 0x50000000) {
          lVar22 = lVar12;
        }
        pGVar11 = lj_ctype_repr(L,(int)((ulong)((long)pCVar8 - (long)pCVar20->tab) >> 3) *
                                  -0x55555555,(GCstr *)0x0);
        pGVar11 = pGVar11 + 1;
        pCVar20 = local_60;
      }
      *local_38 = (ulong)pGVar11;
      lVar12 = 1;
      local_38 = local_88 + 1;
      bVar14 = false;
    } while (bVar25);
    if (((uint)lVar6 ^ (uint)lVar22) == 1) {
      local_88[1] = local_88[(int)(uint)lVar22];
      uVar19 = local_88[(int)(uint)lVar6];
      em = LJ_ERR_FFI_BADCONV;
    }
    else {
      uVar19 = local_88[0];
      if ((uint)local_70 == 5) {
        em = LJ_ERR_FFI_BADLEN;
      }
      else if ((uint)local_70 == 8) {
        em = LJ_ERR_FFI_BADCONCAT;
      }
      else {
        em = LJ_ERR_FFI_BADARITH;
        if ((uint)local_70 < 10) {
          em = LJ_ERR_FFI_BADCOMP;
        }
      }
    }
    lj_err_callerv(L,em,uVar19,local_88[1]);
  }
LAB_0014cf36:
  TVar23 = local_58[1];
  TVar21 = local_58[0];
  if (((uint)local_70 == 5) || ((uint)local_70 == 8)) goto LAB_0014d2cf;
  uVar3 = local_48[0]->info;
  if ((0xfffffff < uVar3) ||
     (((8 < local_48[0]->size || (0xfffffff < local_48[1]->info)) || (8 < local_48[1]->size)))) {
    if ((uVar3 & 0xf0000000) == 0x20000000 || (uVar3 & 0xfc000000) == 0x30000000) {
      if ((((uint)local_70 < 0xc) && ((0x8d0U >> ((uint)local_70 & 0x1f) & 1) != 0)) &&
         ((local_48[1]->info & 0xf0000000) == 0x20000000 ||
          (local_48[1]->info & 0xfc000000) == 0x30000000)) {
        if ((uint)local_70 == 4) {
          bVar14 = local_58[0].u64 != local_58[1].u64;
          goto LAB_0014d0d8;
        }
        iVar18 = lj_cconv_compatptr(pCVar20,local_48[0],local_48[1],8);
        pCVar20 = local_60;
        if (iVar18 != 0) {
          if ((int)local_70 != 0xb) {
            uVar26 = 0xffff7fffffffffff;
            uVar16 = 0xfffeffffffffffff;
            if ((int)local_70 == 6) {
              if (TVar21.u64 < TVar23.u64) {
                uVar26 = 0xfffeffffffffffff;
              }
              L->top[-1].u64 = uVar26;
            }
            else {
              if (TVar23.u64 < TVar21.u64) {
                uVar16 = 0xffff7fffffffffff;
              }
              L->top[-1].u64 = uVar16;
            }
            goto LAB_0014d25e;
          }
          CVar5 = lj_ctype_size(local_60,(uint)(ushort)local_48[0]->info);
          pCVar20 = local_60;
          if (1 < CVar5 + 1) {
            L->top[-1].n = (double)(int)((long)(TVar21.u64 - (long)TVar23) / (long)(int)CVar5);
            goto LAB_0014d25e;
          }
        }
      }
      else if ((((uint)local_70 & 0xfffffffe) == 10) && (local_48[1]->info < 0x10000000)) {
        lj_cconv_ct_ct(pCVar20,pCVar20->tab + 0xb,local_48[1],(uint8_t *)local_88,
                       (uint8_t *)local_58[1],0);
        local_48[1] = local_48[0];
        pCVar20 = local_60;
        if ((uint)local_70 == 0xb) {
          local_88[0] = -local_88[0];
        }
        goto LAB_0014d1cb;
      }
    }
    else if (((uint)local_70 == 10 && uVar3 < 0x10000000) &&
            ((local_48[1]->info & 0xf0000000) == 0x20000000 ||
             (local_48[1]->info & 0xfc000000) == 0x30000000)) {
      lj_cconv_ct_ct(pCVar20,pCVar20->tab + 0xb,local_48[0],(uint8_t *)local_88,
                     (uint8_t *)local_58[0],0);
      TVar21 = TVar23;
LAB_0014d1cb:
      CVar5 = lj_ctype_size(pCVar20,(uint)(ushort)local_48[1]->info);
      if (CVar5 != 0xffffffff) {
        lVar6 = (long)(int)CVar5 * local_88[0];
        CVar4 = lj_ctype_intern(pCVar20,(ushort)local_48[1]->info | 0x20030000,8);
        pvVar9 = lj_mem_newgco(pCVar20->L,0x18);
        *(undefined1 *)((long)pvVar9 + 9) = 10;
        *(short *)((long)pvVar9 + 10) = (short)CVar4;
        *(uint8_t **)((long)pvVar9 + 0x10) = (uint8_t *)(TVar21.u64 + lVar6);
        L->top[-1].u64 = (ulong)pvVar9 | 0xfffa800000000000;
        goto LAB_0014d24c;
      }
    }
    goto LAB_0014d2cf;
  }
  iVar18 = 0xc;
  if ((((byte)(uVar3 >> 0x17) & local_48[0]->size == 8) == 0) &&
     (iVar18 = 0xb, (local_48[1]->info >> 0x17 & 1) != 0)) {
    iVar18 = (local_48[1]->size == 8) + 0xb;
  }
  pCVar8 = (CType *)((long)&pCVar20->tab->info + (ulong)(uint)(iVar18 * 0x18));
  lj_cconv_ct_ct(pCVar20,pCVar8,local_48[0],(uint8_t *)local_88,(uint8_t *)local_58[0],0);
  iVar24 = (int)local_70;
  if (iVar24 == 0x10) {
    pvVar9 = lj_mem_newgco(pCVar20->L,0x18);
    *(undefined1 *)((long)pvVar9 + 9) = 10;
    *(short *)((long)pvVar9 + 10) = (short)iVar18;
    puVar27 = (ulong *)((long)pvVar9 + 0x10);
    L->top[-1].u64 = (ulong)pvVar9 | 0xfffa800000000000;
switchD_0014d58c_caseD_10:
    local_68 = -local_88[0];
    goto LAB_0014d02c;
  }
  lj_cconv_ct_ct(pCVar20,pCVar8,local_48[1],(uint8_t *)&local_68,(uint8_t *)local_58[1],0);
  if (iVar24 == 7) {
    bVar14 = local_88[0] <= local_68;
    if (iVar18 == 0xb) {
      bVar14 = (long)local_88[0] <= (long)local_68;
    }
    bVar14 = (bool)(bVar14 ^ 1);
LAB_0014d0d8:
    L->top[-1].u64 = ((ulong)bVar14 << 0x2f) + 0xfffeffffffffffff;
    goto LAB_0014d25e;
  }
  if (iVar24 == 6) {
    bVar14 = local_88[0] < local_68;
    if (iVar18 == 0xb) {
      bVar14 = (long)local_88[0] < (long)local_68;
    }
    bVar14 = (bool)(bVar14 ^ 1);
    goto LAB_0014d0d8;
  }
  if (iVar24 == 4) {
    L->top[-1].u64 = ((ulong)(local_88[0] != local_68) << 0x2f) + 0xfffeffffffffffff;
    goto LAB_0014d25e;
  }
  pvVar9 = lj_mem_newgco(local_60->L,0x18);
  *(undefined1 *)((long)pvVar9 + 9) = 10;
  *(short *)((long)pvVar9 + 10) = (short)iVar18;
  L->top[-1].u64 = (ulong)pvVar9 | 0xfffa800000000000;
  if (6 < iVar24 - 10U) goto LAB_0014d24c;
  puVar27 = (ulong *)((long)pvVar9 + 0x10);
  switch(iVar24) {
  case 10:
    local_68 = local_68 + local_88[0];
    break;
  case 0xb:
    local_68 = local_88[0] - local_68;
    break;
  case 0xc:
    local_68 = local_68 * local_88[0];
    break;
  case 0xd:
    if (iVar18 == 0xb) {
      uVar19 = 0x8000000000000000;
      if ((local_68 != 0) && (local_68 != 0xffffffffffffffff || local_88[0] != 0x8000000000000000))
      {
        uVar19 = (long)local_88[0] / (long)local_68;
      }
    }
    else if (local_68 == 0) {
      uVar19 = 0x8000000000000000;
    }
    else {
      uVar19 = local_88[0] / local_68;
    }
    *puVar27 = uVar19;
    goto LAB_0014d24c;
  case 0xe:
    uVar19 = 0x8000000000000000;
    if (iVar18 == 0xb) {
      if (local_68 != 0) {
        if (local_68 == 0xffffffffffffffff && local_88[0] == 0x8000000000000000) {
          uVar19 = 0;
        }
        else {
          uVar19 = (long)local_88[0] % (long)local_68;
        }
      }
      *puVar27 = uVar19;
    }
    else {
      if (local_68 != 0) {
        uVar19 = local_88[0] % local_68;
      }
      *puVar27 = uVar19;
    }
    goto LAB_0014d24c;
  case 0xf:
    if (iVar18 == 0xb) {
      local_68 = lj_carith_powi64(local_88[0],local_68);
    }
    else {
      local_68 = lj_carith_powu64(local_88[0],local_68);
    }
    break;
  case 0x10:
    goto switchD_0014d58c_caseD_10;
  }
LAB_0014d02c:
  *puVar27 = local_68;
LAB_0014d24c:
  uVar26 = (L->glref).ptr64;
  if (*(ulong *)(uVar26 + 0x18) <= *(ulong *)(uVar26 + 0x10)) {
    lj_gc_step(L);
  }
LAB_0014d25e:
  *(TValue *)((L->glref).ptr64 + 0xf0) = L->top[-1];
  return 1;
}

Assistant:

int lj_carith_op(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CDArith ca;
  if (carith_checkarg(L, cts, &ca) && mm != MM_len && mm != MM_concat) {
    if (carith_int64(L, cts, &ca, mm) || carith_ptr(L, cts, &ca, mm)) {
      copyTV(L, &G(L)->tmptv2, L->top-1);  /* Remember for trace recorder. */
      return 1;
    }
  }
  return lj_carith_meta(L, cts, &ca, mm);
}